

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::GeneratedCodeInfo_Annotation::InternalSerializeWithCachedSizesToArray
          (GeneratedCodeInfo_Annotation *this,uint8 *target,EpsCopyOutputStream *stream)

{
  byte *pbVar1;
  memory_order mVar2;
  int iVar3;
  uint32 uVar4;
  RepeatedField<int> *this_00;
  int *piVar5;
  uint64 uVar6;
  string *in_RDX;
  int *piVar7;
  byte *in_RSI;
  GeneratedCodeInfo_Annotation *in_RDI;
  int byte_size;
  uint32 cached_has_bits;
  memory_order __b;
  int *end;
  int *it;
  Operation in_stack_fffffffffffffdd8;
  int in_stack_fffffffffffffddc;
  EpsCopyOutputStream *in_stack_fffffffffffffde0;
  int32 value;
  int *in_stack_fffffffffffffdf8;
  string *in_stack_fffffffffffffe00;
  undefined8 in_stack_fffffffffffffe08;
  string *psVar8;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 uVar9;
  undefined4 in_stack_fffffffffffffe28;
  uint uVar10;
  string *psVar11;
  byte *local_1c0;
  int *local_a8;
  byte *local_98;
  byte *local_70;
  ulong local_68;
  byte *local_60;
  byte *local_10;
  uint local_4;
  
  uVar4 = (uint32)((ulong)in_stack_fffffffffffffe08 >> 0x20);
  mVar2 = std::operator&(memory_order_relaxed,__memory_order_mask);
  uVar9 = 0;
  local_4 = (in_RDI->_path_cached_byte_size_).super___atomic_base<int>._M_i;
  local_1c0 = in_RSI;
  if (0 < (int)local_4) {
    psVar11 = in_RDX;
    this_00 = _internal_path(in_RDI);
    psVar8 = in_RDX;
    uVar10 = local_4;
    io::EpsCopyOutputStream::EnsureSpace
              (in_stack_fffffffffffffde0,
               (uint8 **)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
    *in_RSI = 10;
    local_10 = in_RSI + 1;
    for (; 0x7f < local_4; local_4 = local_4 >> 7) {
      *local_10 = (byte)local_4 | 0x80;
      local_10 = local_10 + 1;
    }
    local_98 = local_10 + 1;
    *local_10 = (byte)local_4;
    local_a8 = RepeatedField<int>::data((RepeatedField<int> *)0x519f4e);
    in_stack_fffffffffffffdf8 = local_a8;
    iVar3 = RepeatedField<int>::size(this_00);
    piVar5 = in_stack_fffffffffffffdf8 + iVar3;
    in_stack_fffffffffffffe00 = in_RDX;
    local_4 = uVar10;
    in_RDX = psVar11;
    do {
      io::EpsCopyOutputStream::EnsureSpace
                (in_stack_fffffffffffffde0,
                 (uint8 **)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
      piVar7 = local_a8 + 1;
      uVar6 = io::EpsCopyOutputStream::Encode64((long)*local_a8);
      uVar4 = (uint32)((ulong)psVar8 >> 0x20);
      if (uVar6 < 0x80) {
        *local_98 = (byte)uVar6;
        local_60 = local_98 + 1;
      }
      else {
        *local_98 = (byte)uVar6 | 0x80;
        local_68 = uVar6 >> 7;
        if (local_68 < 0x80) {
          local_98[1] = (byte)local_68;
          local_60 = local_98 + 2;
        }
        else {
          pbVar1 = local_98 + 1;
          do {
            local_70 = pbVar1;
            *local_70 = (byte)local_68 | 0x80;
            local_68 = local_68 >> 7;
            pbVar1 = local_70 + 1;
          } while (0x7f < local_68);
          local_60 = local_70 + 2;
          local_70[1] = (byte)local_68;
        }
      }
      local_98 = local_60;
      local_a8 = piVar7;
    } while (piVar7 < piVar5);
    local_1c0 = local_60;
  }
  uVar10 = (in_RDI->_has_bits_).has_bits_[0];
  if ((uVar10 & 1) != 0) {
    _internal_source_file_abi_cxx11_((GeneratedCodeInfo_Annotation *)0x51a192);
    std::__cxx11::string::data();
    _internal_source_file_abi_cxx11_((GeneratedCodeInfo_Annotation *)0x51a1a9);
    std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              ((char *)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8
               ,(char *)0x51a1c9);
    _internal_source_file_abi_cxx11_((GeneratedCodeInfo_Annotation *)0x51a1dd);
    local_1c0 = io::EpsCopyOutputStream::WriteStringMaybeAliased
                          ((EpsCopyOutputStream *)CONCAT44(uVar9,in_stack_fffffffffffffe10),uVar4,
                           in_stack_fffffffffffffe00,(uint8 *)in_stack_fffffffffffffdf8);
  }
  if ((uVar10 & 2) != 0) {
    io::EpsCopyOutputStream::EnsureSpace
              (in_stack_fffffffffffffde0,
               (uint8 **)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
    _internal_begin(in_RDI);
    uVar4 = internal::WireFormatLite::MakeTag(3,WIRETYPE_VARINT);
    io::CodedOutputStream::WriteVarint32ToArray(uVar4,local_1c0);
    local_1c0 = io::CodedOutputStream::WriteVarint32SignExtendedToArray
                          ((int32)((ulong)in_stack_fffffffffffffde0 >> 0x20),
                           (uint8 *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
  }
  if ((uVar10 & 4) != 0) {
    io::EpsCopyOutputStream::EnsureSpace
              (in_stack_fffffffffffffde0,
               (uint8 **)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
    value = (int32)((ulong)in_stack_fffffffffffffde0 >> 0x20);
    _internal_end(in_RDI);
    uVar4 = internal::WireFormatLite::MakeTag(4,WIRETYPE_VARINT);
    io::CodedOutputStream::WriteVarint32ToArray(uVar4,local_1c0);
    local_1c0 = io::CodedOutputStream::WriteVarint32SignExtendedToArray
                          (value,(uint8 *)CONCAT44(in_stack_fffffffffffffddc,
                                                   in_stack_fffffffffffffdd8));
  }
  if (((uint)(in_RDI->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    if (((uint)(in_RDI->_internal_metadata_).
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               .ptr_ & 1) == 1) {
      internal::
      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
      ::
      PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                  *)&in_RDI->_internal_metadata_);
    }
    else {
      internal::InternalMetadataWithArena::default_instance();
    }
    local_1c0 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                          ((UnknownFieldSet *)in_RDX,(uint8 *)CONCAT44(uVar10,local_4),
                           (EpsCopyOutputStream *)CONCAT44(mVar2,in_stack_fffffffffffffe28));
  }
  return local_1c0;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* GeneratedCodeInfo_Annotation::InternalSerializeWithCachedSizesToArray(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.GeneratedCodeInfo.Annotation)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated int32 path = 1 [packed = true];
  {
    int byte_size = _path_cached_byte_size_.load(std::memory_order_relaxed);
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          1, _internal_path(), byte_size, target);
    }
  }

  cached_has_bits = _has_bits_[0];
  // optional string source_file = 2;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_source_file().data(), static_cast<int>(this->_internal_source_file().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.GeneratedCodeInfo.Annotation.source_file");
    target = stream->WriteStringMaybeAliased(
        2, this->_internal_source_file(), target);
  }

  // optional int32 begin = 3;
  if (cached_has_bits & 0x00000002u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(3, this->_internal_begin(), target);
  }

  // optional int32 end = 4;
  if (cached_has_bits & 0x00000004u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(4, this->_internal_end(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields(), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.GeneratedCodeInfo.Annotation)
  return target;
}